

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetObjectLibrariesCMP0026
          (cmGeneratorTarget *this,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs)

{
  char *__s1;
  iterator __position;
  pointer pbVar1;
  int iVar2;
  size_type sVar3;
  pointer pbVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmStringRange cVar6;
  string objLibName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmGeneratorTarget *objLib;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *local_38;
  
  local_50 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)objlibs;
  local_40 = this;
  cVar6 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
  if (cVar6.Begin._M_current._M_current != cVar6.End._M_current._M_current) {
    do {
      local_48 = cVar6.End._M_current;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(cVar6.Begin._M_current._M_current,&local_68,false);
      pbVar1 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1
          ) {
        __s1 = (pbVar4->_M_dataplus)._M_p;
        iVar2 = strncmp(__s1,"$<TARGET_OBJECTS:",0x11);
        if ((iVar2 == 0) && (__s1[pbVar4->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)pbVar4);
          sVar3 = cmGeneratorExpression::Find(&local_88);
          if (sVar3 == 0xffffffffffffffff) {
            local_38 = cmLocalGenerator::FindGeneratorTargetToUse
                                 (local_40->LocalGenerator,&local_88);
            if (local_38 != (cmGeneratorTarget *)0x0) {
              __position._M_current = *(cmGeneratorTarget ***)(local_50 + 8);
              if (__position._M_current == *(cmGeneratorTarget ***)(local_50 + 0x10)) {
                std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
                _M_realloc_insert<cmGeneratorTarget*const&>(local_50,__position,&local_38);
              }
              else {
                *__position._M_current = local_38;
                *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      _Var5._M_current = cVar6.Begin._M_current._M_current + 1;
      cVar6.End._M_current = local_48._M_current;
      cVar6.Begin._M_current = _Var5._M_current;
    } while (_Var5._M_current != local_48._M_current);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectLibrariesCMP0026(
  std::vector<cmGeneratorTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  cmStringRange rng = this->Target->GetSourceEntries();
  for (std::string const& entry : rng) {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::string const& li : files) {
      if (cmHasLiteralPrefix(li, "$<TARGET_OBJECTS:") && li.back() == '>') {
        std::string objLibName = li.substr(17, li.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          continue;
        }
        cmGeneratorTarget* objLib =
          this->LocalGenerator->FindGeneratorTargetToUse(objLibName);
        if (objLib) {
          objlibs.push_back(objLib);
        }
      }
    }
  }
}